

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsElfFile.cpp
# Opt level: O2

void __thiscall DirectiveLoadMipsElf::writeTempData(DirectiveLoadMipsElf *this,TempData *tempData)

{
  bool bVar1;
  int64_t memoryAddress;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string sStack_88;
  string local_68;
  string local_48;
  
  this_00 = &sStack_88;
  bVar1 = ghc::filesystem::path::empty(&this->outputName);
  memoryAddress = FileManager::getVirtualAddress(g_fileManager);
  if (bVar1) {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_68,&this->inputName);
    tinyformat::format<std::__cxx11::string>
              (&sStack_88,(tinyformat *)".loadelf \"%s\"",(char *)&local_68,in_RCX);
    TempData::writeLine(tempData,memoryAddress,&sStack_88);
  }
  else {
    ghc::filesystem::path::u8string_abi_cxx11_(&local_68,&this->inputName);
    ghc::filesystem::path::u8string_abi_cxx11_(&local_48,&this->outputName);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&sStack_88,(tinyformat *)".loadelf \"%s\",\"%s\"",(char *)&local_68,&local_48,in_R8);
    TempData::writeLine(tempData,memoryAddress,&sStack_88);
    std::__cxx11::string::~string((string *)&sStack_88);
    this_00 = &local_48;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void DirectiveLoadMipsElf::writeTempData(TempData& tempData) const
{
	if (outputName.empty())
	{
		tempData.writeLine(g_fileManager->getVirtualAddress(),tfm::format(".loadelf \"%s\"",inputName.u8string()));
	} else {
		tempData.writeLine(g_fileManager->getVirtualAddress(),tfm::format(".loadelf \"%s\",\"%s\"",
			inputName.u8string(),outputName.u8string()));
	}
}